

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.h
# Opt level: O3

void __thiscall
cfd::core::DescriptorScriptReference::~DescriptorScriptReference(DescriptorScriptReference *this)

{
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             (this + 0x338));
  std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)(this + 800));
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x318) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x318));
  }
  *(code **)(this + 0x280) = cfd::core::SchnorrSignature::SchnorrSignature;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             (this + 0x2f8));
  TapBranch::~TapBranch((TapBranch *)(this + 0x280));
  TapBranch::~TapBranch((TapBranch *)(this + 0x200));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(this + 0x1c8));
  Script::~Script((Script *)(this + 0x188));
  *(code **)(this + 0xf8) = cfd::core::SchnorrSignature::SchnorrSignature;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             (this + 0x170));
  TapBranch::~TapBranch((TapBranch *)(this + 0xf8));
  if (*(void **)(this + 0xe0) != (void *)0x0) {
    operator_delete(*(void **)(this + 0xe0));
  }
  if (*(void **)(this + 200) != (void *)0x0) {
    operator_delete(*(void **)(this + 200));
  }
  if (*(void **)(this + 0xb0) != (void *)0x0) {
    operator_delete(*(void **)(this + 0xb0));
  }
  if (*(DescriptorScriptReference **)(this + 0x90) != this + 0xa0) {
    operator_delete(*(DescriptorScriptReference **)(this + 0x90));
  }
  Script::~Script((Script *)(this + 0x48));
  Script::~Script((Script *)(this + 8));
  return;
}

Assistant:

class CFD_CORE_EXPORT DescriptorScriptReference {
 public:
  /**
   * @brief constructor.
   */
  DescriptorScriptReference();
  /**
   * @brief constructor.
   * @details `raw` type only.
   * @param[in] locking_script    locking script
   * @param[in] script_type       script type
   * @param[in] address_prefixes  address prefix list
   */
  explicit DescriptorScriptReference(
      const Script& locking_script, DescriptorScriptType script_type,
      const std::vector<AddressFormatData>& address_prefixes);
  /**
   * @brief constructor.
   * @details `sh` or `wsh` type only.
   * @param[in] locking_script    locking script
   * @param[in] script_type       script type
   * @param[in] child_script      child script node
   * @param[in] address_prefixes  address prefix list
   */
  explicit DescriptorScriptReference(
      const Script& locking_script, DescriptorScriptType script_type,
      const DescriptorScriptReference& child_script,
      const std::vector<AddressFormatData>& address_prefixes);
  /**
   * @brief constructor.
   * @param[in] locking_script    locking script
   * @param[in] script_type       script type
   * @param[in] key_list          key(pubkey, extprivkey, extpubkey) list
   * @param[in] address_prefixes  address prefix list
   * @param[in] req_sig_num       multisig require signature num
   */
  explicit DescriptorScriptReference(
      const Script& locking_script, DescriptorScriptType script_type,
      const std::vector<DescriptorKeyReference>& key_list,
      const std::vector<AddressFormatData>& address_prefixes,
      const uint32_t req_sig_num = 0);
  /**
   * @brief constructor.
   * @param[in] address_script    address script
   * @param[in] address_prefixes  address prefix list
   */
  explicit DescriptorScriptReference(
      const Address& address_script,
      const std::vector<AddressFormatData>& address_prefixes);
  /**
   * @brief constructor.
   * @param[in] locking_script    locking script
   * @param[in] script_type       script type
   * @param[in] key_list          key(pubkey, extprivkey, extpubkey) list
   * @param[in] tapbranch         taproot tapbranch
   * @param[in] address_prefixes  address prefix list
   */
  explicit DescriptorScriptReference(
      const Script& locking_script, DescriptorScriptType script_type,
      const std::vector<DescriptorKeyReference>& key_list,
      const TapBranch& tapbranch,
      const std::vector<AddressFormatData>& address_prefixes);
  /**
   * @brief constructor.
   * @param[in] locking_script    locking script
   * @param[in] script_type       script type
   * @param[in] key_list          key(pubkey, extprivkey, extpubkey) list
   * @param[in] script_tree       taproot script tree
   * @param[in] address_prefixes  address prefix list
   */
  explicit DescriptorScriptReference(
      const Script& locking_script, DescriptorScriptType script_type,
      const std::vector<DescriptorKeyReference>& key_list,
      const TaprootScriptTree& script_tree,
      const std::vector<AddressFormatData>& address_prefixes);
  /**
   * @brief copy constructor.
   * @param[in] object    DescriptorScriptReference object
   */
  DescriptorScriptReference(const DescriptorScriptReference& object);
  /**
   * @brief copy constructor.
   * @param[in] object    DescriptorScriptReference object
   * @return DescriptorScriptReference object
   */
  DescriptorScriptReference& operator=(
      const DescriptorScriptReference& object);

  /**
   * @brief getting locking script.
   * @return locking script
   */
  Script GetLockingScript() const;
  /**
   * @brief exist address data.
   * @retval true  exist
   * @retval false not exist
   */
  bool HasAddress() const;
  /**
   * @brief getting address.
   * @param[in] net_type    network type
   * @return address
   */
  Address GenerateAddress(NetType net_type) const;
  /**
   * @brief getting address list.
   * @param[in] net_type    network type
   * @return address list
   */
  std::vector<Address> GenerateAddresses(NetType net_type) const;
  /**
   * @brief getting address type.
   * @return address type
   */
  AddressType GetAddressType() const;
  /**
   * @brief getting hash type.
   * @return hash type
   */
  HashType GetHashType() const;

  // script api
  /**
   * @brief exist redeem script.
   * @retval true  exist
   * @retval false not exist
   */
  bool HasRedeemScript() const;
  /**
   * @brief getting redeem script.
   * @return redeem script
   */
  Script GetRedeemScript() const;
  /**
   * @brief exist child script node.
   * @retval true  exist
   * @retval false not exist
   */
  bool HasChild() const;
  /**
   * @brief getting child script node.
   * @return child script node
   */
  DescriptorScriptReference GetChild() const;
  /**
   * @brief exists multisig require signature num.
   * @retval true exist
   * @retval false not exist
   */
  bool HasReqNum() const;
  /**
   * @brief getting multisig require signature num.
   * @return require signature num
   */
  uint32_t GetReqNum() const;

  // key api
  /**
   * @brief exist key list.
   * @retval true  exist
   * @retval false not exist
   */
  bool HasKey() const;
  /**
   * @brief getting key list number.
   * @return key list number
   */
  uint32_t GetKeyNum() const;
  /**
   * @brief getting key list.
   * @return key list
   */
  std::vector<DescriptorKeyReference> GetKeyList() const;

  // taproot api
  /**
   * @brief exist taproot tapbranch.
   * @retval true  exist
   * @retval false not exist
   */
  bool HasTapBranch() const;
  /**
   * @brief getting taproot tapbranch.
   * @return tapbranch
   */
  TapBranch GetTapBranch() const;
  /**
   * @brief exist taproot script tree.
   * @retval true  exist
   * @retval false not exist
   */
  bool HasScriptTree() const;
  /**
   * @brief getting taproot script tree.
   * @return taproot script tree
   */
  TaprootScriptTree GetScriptTree() const;

  /**
   * @brief getting script type.
   * @return script type
   */
  DescriptorScriptType GetScriptType() const;

 private:
  DescriptorScriptType script_type_;  //!< node script type
  Script locking_script_;             //!< locking script
  bool is_script_;                    //!< exist redeem script
  Script redeem_script_;              //!< redeem script
  Address address_script_;            //!< address script data
  uint32_t req_num_;                  //!< multisig require signature number
  TapBranch tapbranch_;               //!< taproot branch
  bool is_tapbranch_;                 //!< exist tapbranch
  TaprootScriptTree script_tree_;     //!< taproot script tree
  //! child script
  std::shared_ptr<DescriptorScriptReference> child_script_ = nullptr;
  std::vector<DescriptorKeyReference> keys_;      //!< key list
  std::vector<AddressFormatData> addr_prefixes_;  //!< address prefixes
}